

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  ulong uVar1;
  uint32_t *puVar2;
  Command *p;
  int iVar3;
  ulong uVar4;
  BrotliEncoderState *s;
  ulong uVar5;
  ZopfliNode *array;
  ulong uVar6;
  size_t sVar7;
  Command *__dest;
  byte bVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char cVar17;
  ulong uVar18;
  uint8_t *puVar19;
  size_t __n;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  H10 *pHVar23;
  ulong uVar24;
  ContextType literal_context_mode;
  uint8_t *__s2;
  uint64_t position;
  long lVar25;
  ulong uVar26;
  uint8_t uVar27;
  ulong uVar28;
  size_t sVar29;
  ulong uVar30;
  uint64_t last_flush_pos;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  ulong local_280;
  ulong local_278;
  undefined8 local_270;
  ulong local_268;
  Command *local_260;
  size_t local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  H10 *local_230;
  ulong local_228;
  ulong local_220;
  uint8_t *local_218;
  size_t num_literals;
  int saved_dist_cache [4];
  int dist_cache [4];
  ulong local_1e0;
  MemoryManager memory_manager;
  uint8_t *local_1b0;
  ulong local_1a0;
  size_t last_insert_len;
  BrotliEncoderParams params;
  size_t available_in;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  local_258 = *encoded_size;
  if (input_size == 0) {
    local_248 = 1;
  }
  else {
    uVar4 = ((input_size + (input_size >> 0x18) * 4) -
            (ulong)(((uint)input_size & 0xffffff) < 0x100001)) + 7;
    local_248 = 0;
    if (input_size <= uVar4) {
      local_248 = uVar4;
    }
  }
  if (local_258 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *encoded_size = 1;
    *encoded_buffer = '\x06';
  }
  else {
    local_268 = input_size;
    if (quality == 10) {
      uVar11 = 0x10;
      if (0x10 < lgwin) {
        uVar11 = lgwin;
      }
      params.lgblock = 0x12;
      if ((int)uVar11 < 0x12) {
        params.lgblock = uVar11;
      }
      if (lgwin < 0x11) {
        params.lgblock = 0x10;
      }
      uVar4 = 0x18;
      if ((int)uVar11 < 0x18) {
        uVar4 = (ulong)uVar11;
      }
      local_280 = 1;
      iVar3 = (int)uVar4;
      bVar8 = (byte)uVar4;
      uVar30 = 1L << (bVar8 & 0x3f);
      dist_cache[0] = 4;
      dist_cache[1] = 0xb;
      dist_cache[2] = 0xf;
      dist_cache[3] = 0x10;
      saved_dist_cache[0] = 4;
      saved_dist_cache[1] = 0xb;
      saved_dist_cache[2] = 0xf;
      saved_dist_cache[3] = 0x10;
      uVar5 = uVar30;
      if (input_size < uVar30) {
        uVar5 = input_size;
      }
      cVar17 = '\x17';
      if ((int)uVar11 < 0x17) {
        cVar17 = (char)uVar11;
      }
      uVar13 = 1L << (cVar17 + 1U & 0x3f);
      params.mode = BROTLI_MODE_GENERIC;
      params._20_8_ = 0;
      params.quality = 10;
      params.size_hint._0_4_ = 0;
      uVar14 = 1L << ((byte)params.lgblock & 0x3f);
      params.lgwin = iVar3;
      BrotliInitMemoryManager
                (&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if (0x8000000000000000 < input_size) {
        __assert_fail("input_size <= mask + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                      ,0x429,
                      "int BrotliCompressBufferQuality10(int, size_t, const uint8_t *, size_t *, uint8_t *)"
                     );
      }
      if (iVar3 == 0x10) {
        local_270 = 0;
      }
      else if (iVar3 == 0x11) {
        local_280 = 7;
        local_270 = 1;
      }
      else {
        if (lgwin < 0x12) {
          cVar17 = bVar8 * '\x10' + -0x7f;
          local_280 = 7;
        }
        else {
          cVar17 = bVar8 * '\x02' + -0x21;
          local_280 = 4;
        }
        local_270 = CONCAT71((int7)(uVar4 >> 8),cVar17);
      }
      uVar4 = uVar13 >> 3;
      local_230 = (H10 *)BrotliAllocate(&memory_manager,0x80028);
      local_230->forest_ = (uint32_t *)0x0;
      local_230->forest_size_ = 0;
      local_230->is_dirty_ = 1;
      InitH10(&memory_manager,local_230,(uint8_t *)&params,(BrotliEncoderParams *)0x0,uVar5,1,
              (int)input_buffer);
      local_1b0 = encoded_buffer;
      local_240 = 0;
      bVar8 = 0;
      local_1a0 = 0;
      last_flush_pos = 0;
      do {
        uVar5 = uVar13 + last_flush_pos;
        if (input_size < uVar5) {
          uVar5 = input_size;
        }
        uVar15 = (uVar5 - last_flush_pos) / 0xc + 0x10;
        last_insert_len = 0;
        num_literals = 0;
        local_250 = 0;
        sVar29 = 0;
        local_1e0 = 0;
        __dest = (Command *)0x0;
        position = last_flush_pos;
        puVar19 = input_buffer;
        while( true ) {
          uVar9 = uVar5 - position;
          uVar28 = local_250;
          input_buffer = puVar19;
          if (uVar5 < position || uVar9 == 0) break;
          local_238 = uVar9;
          if (uVar14 <= uVar9) {
            local_238 = uVar14;
          }
          sVar7 = local_238 + 1;
          local_260 = __dest;
          array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar7 * 0x10);
          BrotliInitZopfliNodes(array,sVar7);
          pHVar23 = local_230;
          input_buffer = puVar19;
          if ((0x7f < position) && (2 < local_238)) {
            uVar28 = position - 0x7f;
            uVar9 = (local_238 + position) - 0x7f;
            if (position < uVar9) {
              uVar9 = position;
            }
            if (uVar28 < uVar9) {
              uVar1 = local_230->window_mask_;
              puVar10 = puVar19;
LAB_0012c827:
              uVar31 = position - uVar28;
              if (uVar31 < 0x10) {
                uVar31 = 0xf;
              }
              local_218 = puVar10 + (uVar28 & 0x7fffffffffffffff);
              uVar11 = (uint)(*(int *)(puVar10 + (uVar28 & 0x7fffffffffffffff)) * 0x1e35a7bd) >> 0xf
              ;
              uVar26 = (ulong)pHVar23->buckets_[uVar11];
              uVar24 = (uVar28 & uVar1) * 2 + 1;
              uVar32 = (uVar28 & uVar1) * 2;
              pHVar23->buckets_[uVar11] = (uint32_t)uVar28;
              lVar20 = 0x40;
              local_220 = 0;
              local_228 = 0;
              puVar19 = puVar10;
LAB_0012c8ad:
              if ((uVar28 != uVar26) && (lVar20 != 0 && uVar28 - uVar26 <= uVar1 - uVar31)) {
                uVar6 = local_228;
                if (local_220 < local_228) {
                  uVar6 = local_220;
                }
                if (0x80 < uVar6) {
                  __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                ,0x9d,
                                "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                               );
                }
                __s2 = puVar19 + uVar26;
                puVar19 = __s2 + uVar6;
                uVar16 = 0x80 - uVar6;
                if (uVar6 < 0x79) {
                  uVar18 = (ulong)((uint)uVar16 & 0xf8);
                  lVar25 = 0;
                  uVar22 = 0;
LAB_0012c94d:
                  if (*(ulong *)(puVar19 + uVar22 * 8) ==
                      *(ulong *)(puVar10 + uVar22 * 8 + uVar6 + (uVar28 & 0x7fffffffffffffff)))
                  goto code_r0x0012c95a;
                  uVar18 = *(ulong *)(puVar10 + uVar22 * 8 + uVar6 + (uVar28 & 0x7fffffffffffffff))
                           ^ *(ulong *)(puVar19 + uVar22 * 8);
                  uVar16 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar22 = (uVar16 >> 3 & 0x1fffffff) - lVar25;
                  goto LAB_0012c97b;
                }
                uVar18 = 0;
                goto LAB_0012ca5d;
              }
              puVar2 = pHVar23->forest_;
              puVar2[uVar32] = pHVar23->invalid_pos_;
              puVar2[uVar24] = pHVar23->invalid_pos_;
              bVar33 = false;
              goto LAB_0012ca4e;
            }
          }
LAB_0012cab1:
          sVar7 = BrotliZopfliComputeShortestPath
                            (&memory_manager,local_238,position,puVar19,0x7fffffffffffffff,&params,
                             uVar30 - 0x10,dist_cache,pHVar23,array);
          uVar28 = local_250 + sVar7 + 1;
          if (uVar28 < uVar15) {
            uVar28 = uVar15;
          }
          __dest = local_260;
          if ((local_1e0 != uVar28) &&
             (__dest = (Command *)BrotliAllocate(&memory_manager,uVar28 << 4), p = local_260,
             local_1e0 = uVar28, local_260 != (Command *)0x0)) {
            memcpy(__dest,local_260,local_250 << 4);
            BrotliFree(&memory_manager,p);
          }
          uVar9 = local_238;
          uVar28 = sVar7 + local_250;
          BrotliZopfliCreateCommands
                    (local_238,position,uVar30 - 0x10,array,dist_cache,&last_insert_len,
                     __dest + local_250,&num_literals);
          sVar29 = sVar29 + uVar9;
          BrotliFree(&memory_manager,array);
          if ((uVar4 < uVar28) ||
             (position = position + uVar9, puVar19 = input_buffer, local_250 = uVar28,
             uVar4 < num_literals)) break;
        }
        uVar5 = uVar28;
        if (last_insert_len != 0) {
          __dest[uVar28].insert_len_ = (uint32_t)last_insert_len;
          __dest[uVar28].copy_len_ = 0x4000000;
          __dest[uVar28].dist_extra_ = 0;
          __dest[uVar28].dist_prefix_ = 0x10;
          if (last_insert_len < 6) {
            uVar15 = last_insert_len & 0xffffffff;
          }
          else if (last_insert_len < 0x82) {
            uVar11 = 0x1f;
            uVar12 = (uint)(last_insert_len - 2);
            if (uVar12 != 0) {
              for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar15 = (ulong)((int)(last_insert_len - 2 >>
                                  ((char)(uVar11 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar11 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (last_insert_len < 0x842) {
            uVar12 = (uint32_t)last_insert_len - 0x42;
            uVar11 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar15 = (ulong)((uVar11 ^ 0xffe0) + 0x2a);
          }
          else {
            uVar15 = 0x15;
            if (0x1841 < last_insert_len) {
              uVar15 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
            }
          }
          uVar5 = uVar28 + 1;
          __dest[uVar28].cmd_prefix_ =
               (short)uVar15 * 8 & 0x38U |
               *(ushort *)
                (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar15 & 0xffff) >> 3) * 3) * 2) |
               2;
          num_literals = num_literals + last_insert_len;
        }
        uVar15 = sVar29 + last_flush_pos;
        bVar33 = uVar15 == local_268;
        local_278 = local_280;
        local_260 = __dest;
        if (sVar29 == 0) {
          puVar19 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
          *puVar19 = (uint8_t)local_270;
          uVar5 = local_278 & 0xffffff07;
          *(ulong *)(puVar19 + (local_278 >> 3)) =
               3L << (sbyte)uVar5 | (ulong)puVar19[local_278 >> 3];
          local_278 = (ulong)((int)local_278 + 9U & 0xfffffff8);
        }
        else {
          puVar10 = input_buffer;
          iVar3 = ShouldCompress(input_buffer,0x7fffffffffffffff,last_flush_pos,sVar29,num_literals,
                                 uVar5);
          if (iVar3 == 0) {
            dist_cache[0] = saved_dist_cache[0];
            dist_cache[1] = saved_dist_cache[1];
            dist_cache[2] = saved_dist_cache[2];
            dist_cache[3] = saved_dist_cache[3];
            puVar19 = (uint8_t *)BrotliAllocate(&memory_manager,sVar29 + 0x10);
            *puVar19 = (uint8_t)local_270;
            uVar5 = 0x7fffffffffffffff;
            BrotliStoreUncompressedMetaBlock
                      ((uint)bVar33,input_buffer,last_flush_pos,0x7fffffffffffffff,sVar29,&local_278
                       ,puVar19);
            input_buffer = puVar10;
          }
          else {
            local_218 = (uint8_t *)(ulong)bVar33;
            BrotliInitBlockSplit((BlockSplit *)&available_in);
            BrotliInitBlockSplit(&local_e0);
            BrotliInitBlockSplit(&local_b0);
            local_40 = (HistogramDistance *)0x0;
            sStack_38 = 0;
            local_50 = (HistogramCommand *)0x0;
            sStack_48 = 0;
            local_60 = (HistogramLiteral *)0x0;
            sStack_58 = 0;
            local_70 = (uint32_t *)0x0;
            sStack_68 = 0;
            local_80 = (uint32_t *)0x0;
            sStack_78 = 0;
            iVar3 = BrotliIsMostlyUTF8(input_buffer,last_flush_pos,0x7fffffffffffffff,sVar29,0.75);
            literal_context_mode = (iVar3 == 0) + CONTEXT_UTF8;
            local_220 = local_1a0;
            local_228 = CONCAT44(local_228._4_4_,(uint)bVar8);
            BrotliBuildMetaBlock
                      (&memory_manager,input_buffer,last_flush_pos,0x7fffffffffffffff,&params,bVar8,
                       (uint8_t)local_1a0,local_260,uVar5,literal_context_mode,
                       (MetaBlockSplit *)&available_in);
            BrotliOptimizeHistograms(0,0,(MetaBlockSplit *)&available_in);
            puVar19 = (uint8_t *)0x0;
            sVar7 = sVar29 * 2 + 0x1f6;
            if (sVar7 != 0) {
              puVar19 = (uint8_t *)BrotliAllocate(&memory_manager,sVar7);
            }
            uVar27 = (uint8_t)local_270;
            *puVar19 = uVar27;
            iVar3 = (int)local_218;
            BrotliStoreMetaBlock
                      (&memory_manager,puVar10,last_flush_pos,sVar29,0x7fffffffffffffff,
                       (uint8_t)local_228,(uint8_t)local_220,iVar3,0,0,literal_context_mode,
                       local_260,uVar5,(MetaBlockSplit *)&available_in,&local_278,puVar19);
            uVar5 = local_278 >> 3;
            if (sVar29 + 4 < uVar5) {
              dist_cache[0] = saved_dist_cache[0];
              dist_cache[1] = saved_dist_cache[1];
              dist_cache[2] = saved_dist_cache[2];
              dist_cache[3] = saved_dist_cache[3];
              *puVar19 = uVar27;
              local_278 = local_280;
              uVar5 = 0x7fffffffffffffff;
              BrotliStoreUncompressedMetaBlock
                        (iVar3,puVar10,last_flush_pos,0x7fffffffffffffff,sVar29,&local_278,puVar19);
            }
            BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
            BrotliDestroyBlockSplit(&memory_manager,&local_e0);
            BrotliDestroyBlockSplit(&memory_manager,&local_b0);
            BrotliFree(&memory_manager,local_80);
            local_80 = (uint32_t *)0x0;
            BrotliFree(&memory_manager,local_70);
            local_70 = (uint32_t *)0x0;
            BrotliFree(&memory_manager,local_60);
            local_60 = (HistogramLiteral *)0x0;
            BrotliFree(&memory_manager,local_50);
            local_50 = (HistogramCommand *)0x0;
            BrotliFree(&memory_manager,local_40);
            input_buffer = puVar10;
          }
        }
        input_size = local_268;
        uVar28 = local_278;
        uVar9 = local_278 >> 3;
        local_270 = CONCAT71((int7)(uVar5 >> 8),puVar19[uVar9]);
        local_1a0 = (ulong)input_buffer[uVar15 - 2];
        bVar8 = input_buffer[uVar15 - 1];
        saved_dist_cache[0] = dist_cache[0];
        saved_dist_cache[1] = dist_cache[1];
        saved_dist_cache[2] = dist_cache[2];
        saved_dist_cache[3] = dist_cache[3];
        local_240 = local_240 + uVar9;
        if (local_240 <= local_258) {
          memcpy(local_1b0,puVar19,uVar9);
          local_1b0 = local_1b0 + uVar9;
        }
        BrotliFree(&memory_manager,puVar19);
        BrotliFree(&memory_manager,local_260);
        pHVar23 = local_230;
        uVar5 = local_240;
      } while ((local_240 <= local_258) &&
              (local_280 = (ulong)((uint)uVar28 & 7), last_flush_pos = uVar15, uVar15 < input_size))
      ;
      *encoded_size = local_240;
      BrotliFree(&memory_manager,local_230->forest_);
      pHVar23->forest_ = (uint32_t *)0x0;
      BrotliFree(&memory_manager,pHVar23);
      if (uVar5 <= local_258) {
        if (local_248 == 0) {
          return 1;
        }
        if (*encoded_size <= local_248) {
          return 1;
        }
      }
    }
    else {
      s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if (s == (BrotliEncoderState *)0x0) {
        return 0;
      }
      available_in = local_268;
      params.mode = (BrotliEncoderMode)input_buffer;
      params.quality = (int)((ulong)input_buffer >> 0x20);
      memory_manager.alloc_func = (brotli_alloc_func)*encoded_size;
      dist_cache._0_8_ = encoded_buffer;
      saved_dist_cache[0] = 0;
      saved_dist_cache[1] = 0;
      if (s->is_initialized_ == 0) {
        (s->params).quality = quality;
        (s->params).lgwin = lgwin;
        (s->params).mode = mode;
        (s->params).size_hint = local_268 & 0xffffffff;
      }
      iVar3 = BrotliEncoderCompressStream
                        (s,BROTLI_OPERATION_FINISH,&available_in,(uint8_t **)&params,
                         (size_t *)&memory_manager,(uint8_t **)dist_cache,(size_t *)saved_dist_cache
                        );
      if (s->stream_state_ == BROTLI_STREAM_FINISHED) {
        sVar29 = s->available_out_;
        *encoded_size = saved_dist_cache._0_8_;
        BrotliEncoderDestroyInstance(s);
        if ((iVar3 != 0) && (sVar29 == 0)) {
          if (local_248 == 0) {
            return 1;
          }
          if (*encoded_size <= local_248) {
            return 1;
          }
        }
      }
      else {
        *encoded_size = saved_dist_cache._0_8_;
        BrotliEncoderDestroyInstance(s);
      }
    }
    *encoded_size = 0;
    if (local_258 <= local_248 - 1) {
      return 0;
    }
    encoded_buffer[0] = '!';
    encoded_buffer[1] = '\x03';
    lVar20 = 2;
    lVar25 = 0;
    uVar4 = local_268;
    do {
      __n = 0x1000000;
      if (uVar4 < 0x1000000) {
        __n = uVar4;
      }
      iVar3 = 2 - (uint)(uVar4 < 0x100001);
      if (uVar4 < 0x10001) {
        iVar3 = 0;
      }
      uVar12 = ((int)__n * 8 + iVar3 * 2) - 8;
      uVar11 = 0x80000 << ((byte)(iVar3 << 2) & 0x1f) | uVar12;
      encoded_buffer[lVar20] = (uint8_t)uVar12;
      encoded_buffer[lVar20 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
      encoded_buffer[lVar20 + 2] = (uint8_t)(uVar11 >> 0x10);
      if (uVar4 < 0x100001) {
        lVar20 = lVar20 + 3;
      }
      else {
        encoded_buffer[lVar20 + 3] = (uint8_t)(uVar11 >> 0x18);
        lVar20 = lVar20 + 4;
      }
      memcpy(encoded_buffer + lVar20,input_buffer + lVar25,__n);
      lVar20 = lVar20 + __n;
      lVar25 = lVar25 + __n;
      uVar4 = uVar4 - __n;
    } while (uVar4 != 0);
    encoded_buffer[lVar20] = '\x03';
    *encoded_size = lVar20 + 1;
  }
  return 1;
code_r0x0012c95a:
  uVar22 = uVar22 + 1;
  lVar25 = lVar25 + -8;
  if (uVar16 >> 3 == uVar22) goto code_r0x0012c966;
  goto LAB_0012c94d;
code_r0x0012c966:
  puVar19 = puVar19 + -lVar25;
LAB_0012ca5d:
  uVar16 = uVar16 & 7;
  uVar22 = uVar18;
  if (uVar16 != 0) {
    uVar21 = uVar18 | uVar16;
    do {
      uVar22 = uVar18;
      if (puVar10[uVar18 + uVar6 + (uVar28 & 0x7fffffffffffffff)] != *puVar19) break;
      puVar19 = puVar19 + 1;
      uVar18 = uVar18 + 1;
      uVar16 = uVar16 - 1;
      uVar22 = uVar21;
    } while (uVar16 != 0);
  }
LAB_0012c97b:
  uVar22 = uVar22 + uVar6;
  puVar19 = input_buffer;
  iVar3 = bcmp(local_218,__s2,uVar22);
  if (iVar3 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  pHVar23 = local_230;
  input_buffer = puVar19;
  if (uVar22 < 0x80) {
    uVar6 = (uVar26 & uVar1) * 2;
    puVar2 = local_230->forest_;
    if (__s2[uVar22] < local_218[uVar22]) {
      puVar2[uVar32] = (uint32_t)uVar26;
      uVar6 = uVar6 | 1;
      uVar32 = uVar6;
      local_220 = uVar22;
    }
    else {
      puVar2[uVar24] = (uint32_t)uVar26;
      uVar24 = uVar6;
      local_228 = uVar22;
    }
    uVar26 = (ulong)puVar2[uVar6];
    bVar33 = true;
  }
  else {
    puVar2 = local_230->forest_;
    puVar2[uVar32] = puVar2[(uVar26 & uVar1) * 2];
    puVar2[uVar24] = puVar2[(uVar26 & uVar1) * 2 + 1];
    bVar33 = false;
  }
LAB_0012ca4e:
  lVar20 = lVar20 + -1;
  if (!bVar33) goto LAB_0012ca98;
  goto LAB_0012c8ad;
LAB_0012ca98:
  uVar28 = uVar28 + 1;
  puVar10 = puVar19;
  if (uVar28 == uVar9) goto LAB_0012cab1;
  goto LAB_0012c827;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}